

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

bool Trace(DVector3 *start,sector_t *sector,DVector3 *direction,double maxDist,ActorFlags *actorMask
          ,DWORD wallMask,AActor *ignore,FTraceResults *res,DWORD flags,
          _func_ETraceStatus_FTraceResults_ptr_void_ptr *callback,void *callbackdata)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  double local_6a8;
  double dStack_6a0;
  DVector2 local_698;
  double local_688;
  AActor *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  FTraceInfo local_668;
  FTraceResults local_100;
  
  bVar4 = false;
  local_688 = maxDist;
  local_680 = ignore;
  memset(&local_100,0,0xd0);
  local_100.Distance = 3.4028234663852886e+38;
  local_100.Fraction = 3.4028234663852886e+38;
  dVar1 = start->Z;
  local_6a8 = start->X;
  dStack_6a0 = start->Y;
  local_668.Start.X = local_6a8;
  local_668.Start.Y = dStack_6a0;
  local_668.Start.Z = dVar1;
  while (((sector->planes[1].Flags & 0x1d0U) == 0x100 &&
         (sectorPortals.Array[sector->Portals[1]].mPlaneZ <= dVar1 &&
          dVar1 != sectorPortals.Array[sector->Portals[1]].mPlaneZ))) {
    local_6a8 = local_6a8 + sectorPortals.Array[sector->Portals[1]].mDisplacement.X;
    dStack_6a0 = dStack_6a0 + sectorPortals.Array[sector->Portals[1]].mDisplacement.Y;
    local_698.X = local_6a8;
    local_698.Y = dStack_6a0;
    local_668.Start.X = local_6a8;
    local_668.Start.Y = dStack_6a0;
    sector = P_PointInSector(&local_698);
    bVar4 = true;
  }
  if (!bVar4) {
    while (((sector->planes[0].Flags & 0x1d0U) == 0x100 &&
           (dVar1 <= sectorPortals.Array[sector->Portals[0]].mPlaneZ))) {
      local_6a8 = local_6a8 + sectorPortals.Array[sector->Portals[0]].mDisplacement.X;
      dStack_6a0 = dStack_6a0 + sectorPortals.Array[sector->Portals[0]].mDisplacement.Y;
      local_698.X = local_6a8;
      local_698.Y = dStack_6a0;
      local_668.Start.X = local_6a8;
      local_668.Start.Y = dStack_6a0;
      sector = P_PointInSector(&local_698);
    }
  }
  local_668.ActorMask = (ActorFlags)actorMask->Value;
  iVar3 = 7;
  if (local_668.ActorMask.Value == 0) {
    iVar3 = 1;
  }
  dVar2 = direction->Z;
  local_678 = direction->X;
  uStack_670 = direction->Y;
  local_668.IgnoreThis = local_680;
  local_668.MaxDist = local_688;
  local_668.EnterDist = 0.0;
  local_668.TraceCallback = callback;
  local_668.TraceCallbackData = callbackdata;
  local_668.TraceFlags = flags;
  local_668.Results = res;
  local_668.inshootthrough = 1;
  local_668.sectorsel = 0;
  local_668.startfrac = 0.0;
  local_668.Vec.X = local_678;
  local_668.Vec.Y = uStack_670;
  local_668.Vec.Z = dVar2;
  local_668.WallMask = wallMask;
  local_668.CurSector = sector;
  local_668.limitz = dVar1;
  local_668.ptflags = iVar3;
  memset(res,0,0xd0);
  bVar5 = callback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0 & (byte)flags >> 4;
  if (bVar5 == 1) {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.SrcFromTarget.X = local_6a8;
    local_100.SrcFromTarget.Y = dStack_6a0;
    local_100.HitPos.X = local_6a8;
    local_100.HitPos.Y = dStack_6a0;
    local_100.HitVector.X._0_4_ = (undefined4)local_678;
    local_100.HitVector.X._4_4_ = local_678._4_4_;
    local_100.HitVector.Y._0_4_ = (undefined4)uStack_670;
    local_100.HitVector.Y._4_4_ = uStack_670._4_4_;
    local_100.HitPos.Z = dVar1;
    local_100.HitVector.Z = dVar2;
    local_100.SrcFromTarget.Z = dVar1;
    (*callback)(&local_100,callbackdata);
  }
  bVar4 = FTraceInfo::TraceTraverse(&local_668,iVar3);
  if (bVar5 != 0) {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.HitPos.Z = ((local_668.Results)->HitPos).Z;
    local_100.HitPos.X = ((local_668.Results)->HitPos).X;
    local_100.HitPos.Y = ((local_668.Results)->HitPos).Y;
    local_100.HitVector.Z = local_668.Vec.Z;
    local_100.HitVector.X._0_4_ = local_668.Vec.X._0_4_;
    local_100.HitVector.X._4_4_ = local_668.Vec.X._4_4_;
    local_100.HitVector.Y._0_4_ = local_668.Vec.Y._0_4_;
    local_100.HitVector.Y._4_4_ = local_668.Vec.Y._4_4_;
    local_100.SrcFromTarget.X = local_100.HitPos.X;
    local_100.SrcFromTarget.Y = local_100.HitPos.Y;
    local_100.SrcFromTarget.Z = local_100.HitPos.Z;
    (*callback)(&local_100,local_668.TraceCallbackData);
  }
  if (bVar4) {
    if ((flags & 1) == 0) {
      return true;
    }
    if (res->HitType - TRACE_HitFloor < 2) {
      if ((res->HitTexture).texnum != skyflatnum.texnum) {
        return true;
      }
    }
    else {
      if (res->HitType != TRACE_HitWall) {
        return true;
      }
      if (res->Tier != '\x01') {
        return true;
      }
      iVar3 = res->Line->frontsector->planes[1].Texture.texnum;
      if (iVar3 != skyflatnum.texnum) {
        return true;
      }
      if (res->Line->backsector->planes[1].Texture.texnum != iVar3) {
        return true;
      }
    }
    res->HitType = TRACE_HitNone;
  }
  return false;
}

Assistant:

bool Trace(const DVector3 &start, sector_t *sector, const DVector3 &direction, double maxDist,
	ActorFlags actorMask, DWORD wallMask, AActor *ignore, FTraceResults &res, DWORD flags,
	ETraceStatus(*callback)(FTraceResults &res, void *), void *callbackdata)
{
	FTraceInfo inf;
	FTraceResults tempResult;

	memset(&tempResult, 0, sizeof(tempResult));
	tempResult.Fraction = tempResult.Distance = NO_VALUE;

	inf.Start = start;
	GetPortalTransition(inf.Start, sector);
	inf.ptflags = actorMask ? PT_ADDLINES|PT_ADDTHINGS|PT_COMPATIBLE : PT_ADDLINES;
	inf.Vec = direction;
	inf.ActorMask = actorMask;
	inf.WallMask = wallMask;
	inf.IgnoreThis = ignore;
	inf.CurSector = sector;
	inf.MaxDist = maxDist;
	inf.EnterDist = 0;
	inf.TraceCallback = callback;
	inf.TraceCallbackData = callbackdata;
	inf.TraceFlags = flags;
	inf.Results = &res;
	inf.inshootthrough = true;
	inf.sectorsel=0;
	inf.startfrac = 0;
	inf.limitz = inf.Start.Z;
	memset(&res, 0, sizeof(res));

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Start;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}
	bool reslt = inf.TraceTraverse(inf.ptflags);

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Results->HitPos;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}

	if (reslt)
	{ 
		return flags ? EditTraceResult(flags, res) : true;
	}
	else
	{
		return false;
	}
}